

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webm_info.cc
# Opt level: O0

bool anon_unknown.dwarf_4821::OutputTracks(Segment *segment,Options *options,FILE *o,Indent *indent)

{
  Indent *pIVar1;
  __type _Var2;
  bool bVar3;
  undefined8 uVar4;
  long lVar5;
  _anonymous_namespace_ *p_Var6;
  ulong uVar7;
  undefined8 uVar8;
  char *pcVar9;
  unsigned_long uVar10;
  unsigned_long_long uVar11;
  char *str;
  char *str_00;
  double dVar12;
  undefined1 local_a90 [32];
  undefined1 local_a70 [32];
  undefined1 local_a50 [32];
  undefined1 local_a30 [32];
  Indent local_a10;
  uint64_t seek_preroll;
  uint64_t codec_delay;
  int64_t bit_depth;
  int64_t channels;
  AudioTrack *audio_track;
  undefined1 local_9a8 [32];
  undefined1 local_988 [32];
  undefined1 local_968 [32];
  undefined1 local_948 [36];
  float local_924;
  undefined4 local_920;
  float kValueNotPresent;
  int kTypeNotPresent;
  int projection_type;
  Projection *local_8f8;
  Projection *projection;
  undefined1 local_8d0 [32];
  undefined1 local_8b0 [32];
  undefined1 local_890 [32];
  undefined1 local_870 [32];
  undefined1 local_850 [32];
  undefined1 local_830 [32];
  undefined1 local_810 [32];
  undefined1 local_7f0 [32];
  undefined1 local_7d0 [36];
  float local_7ac;
  float min;
  float max;
  PrimaryChromaticity *white;
  PrimaryChromaticity *blue;
  PrimaryChromaticity *green;
  PrimaryChromaticity *red;
  MasteringMetadata *local_768;
  MasteringMetadata *metadata;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  Indent local_5e0;
  int64_t max_fall;
  int64_t max_cll;
  int64_t primaries;
  int64_t transfer_characteristics;
  int64_t range;
  int64_t chroma_siting_vert;
  int64_t chroma_siting_horz;
  int64_t cb_subsampling_vert;
  int64_t cb_subsampling_horz;
  int64_t chroma_subsampling_vert;
  int64_t chroma_subsampling_horz;
  int64_t bits_per_channel;
  int64_t matrix_coefficients;
  Colour *local_538;
  Colour *colour;
  undefined1 local_510 [32];
  undefined1 local_4f0 [32];
  undefined1 local_4d0 [32];
  undefined1 local_4b0 [32];
  undefined1 local_490 [40];
  double frame_rate;
  int64_t display_unit;
  int64_t display_height;
  int64_t display_width;
  int64_t height;
  int64_t width;
  VideoTrack *video_track;
  ContentEncAESSettings *local_418;
  ContentEncAESSettings *aes;
  Indent local_3f0;
  undefined1 local_3c8 [4];
  int k_2;
  int local_3a4;
  undefined1 local_3a0 [4];
  int k_1;
  int local_37c;
  undefined1 local_378 [4];
  int k;
  undefined1 local_358 [40];
  ContentEncryption *encryption;
  undefined1 local_310 [32];
  undefined1 local_2f0 [40];
  ContentEncoding *encoding;
  unsigned_long_long local_2a8;
  uint64_t default_duration;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [40];
  uint local_218;
  Vp9CodecFeatures features;
  string v_vp9;
  _anonymous_namespace_ local_1e8 [8];
  string codec_id_1;
  undefined1 local_1c8 [40];
  uchar *private_data;
  size_t private_size;
  undefined1 local_178 [8];
  wstring codec_name;
  char *codec_id;
  undefined1 local_110 [32];
  Indent local_f0;
  undefined1 local_c0 [8];
  wstring track_name;
  int64_t track_number;
  int64_t track_type;
  VideoTrack *local_70;
  Track *track;
  unsigned_long j;
  undefined1 local_58 [4];
  uint i;
  Tracks *local_38;
  Tracks *tracks;
  Indent *indent_local;
  FILE *o_local;
  Options *options_local;
  Segment *segment_local;
  
  tracks = (Tracks *)indent;
  indent_local = (Indent *)o;
  o_local = (FILE *)options;
  options_local = (Options *)segment;
  local_38 = mkvparser::Segment::GetTracks(segment);
  pIVar1 = indent_local;
  if (local_38 == (Tracks *)0x0) {
    fprintf(_stderr,"Tracks was NULL.\n");
    segment_local._7_1_ = 0;
  }
  else {
    libwebm::Indent::indent_str_abi_cxx11_((Indent *)local_58);
    uVar4 = std::__cxx11::string::c_str();
    fprintf((FILE *)pIVar1,"%sTracks:",uVar4);
    std::__cxx11::string::~string((string *)local_58);
    if (((byte)o_local[3] & 1) != 0) {
      fprintf((FILE *)indent_local,"  @: %lld",local_38->m_element_start);
    }
    if (((byte)o_local[2] & 1) != 0) {
      fprintf((FILE *)indent_local,"  size: %lld",local_38->m_element_size);
    }
    fprintf((FILE *)indent_local,"\n");
    j._4_4_ = 0;
    track = (Track *)mkvparser::Tracks::GetTracksCount(local_38);
    do {
      do {
        if ((Track *)(ulong)j._4_4_ == track) {
          segment_local._7_1_ = 1;
          goto LAB_00133dbd;
        }
        uVar7 = (ulong)j._4_4_;
        j._4_4_ = j._4_4_ + 1;
        local_70 = (VideoTrack *)mkvparser::Tracks::GetTrackByIndex(local_38,uVar7);
      } while (local_70 == (VideoTrack *)0x0);
      libwebm::Indent::Adjust((Indent *)tracks,2);
      pIVar1 = indent_local;
      libwebm::Indent::indent_str_abi_cxx11_((Indent *)&track_type);
      uVar4 = std::__cxx11::string::c_str();
      fprintf((FILE *)pIVar1,"%sTrack:",uVar4);
      std::__cxx11::string::~string((string *)&track_type);
      if (((byte)o_local[3] & 1) != 0) {
        fprintf((FILE *)indent_local,"  @: %lld",(local_70->super_Track).m_element_start);
      }
      if (((byte)o_local[2] & 1) != 0) {
        fprintf((FILE *)indent_local,"  size: %lld",(local_70->super_Track).m_element_size);
      }
      fprintf((FILE *)indent_local,"\n");
      lVar5 = mkvparser::Track::GetType(&local_70->super_Track);
      track_name.field_2._8_8_ = mkvparser::Track::GetNumber(&local_70->super_Track);
      p_Var6 = (_anonymous_namespace_ *)mkvparser::Track::GetNameAsUTF8(&local_70->super_Track);
      (anonymous_namespace)::UTF8ToWideString_abi_cxx11_((wstring *)local_c0,p_Var6,str);
      libwebm::Indent::Adjust((Indent *)tracks,2);
      pIVar1 = indent_local;
      libwebm::Indent::indent_str_abi_cxx11_((Indent *)(local_110 + 0x20));
      uVar4 = std::__cxx11::string::c_str();
      fprintf((FILE *)pIVar1,"%sTrackType   : %ld\n",uVar4,lVar5);
      std::__cxx11::string::~string((string *)(local_110 + 0x20));
      pIVar1 = indent_local;
      libwebm::Indent::indent_str_abi_cxx11_((Indent *)local_110);
      uVar4 = std::__cxx11::string::c_str();
      fprintf((FILE *)pIVar1,"%sTrackNumber : %ld\n",uVar4,track_name.field_2._8_8_);
      std::__cxx11::string::~string((string *)local_110);
      uVar7 = std::__cxx11::wstring::empty();
      pIVar1 = indent_local;
      if ((uVar7 & 1) == 0) {
        libwebm::Indent::indent_str_abi_cxx11_((Indent *)&codec_id);
        uVar4 = std::__cxx11::string::c_str();
        uVar8 = std::__cxx11::wstring::c_str();
        fprintf((FILE *)pIVar1,"%sName        : %ls\n",uVar4,uVar8);
        std::__cxx11::string::~string((string *)&codec_id);
      }
      pcVar9 = mkvparser::Track::GetCodecId(&local_70->super_Track);
      pIVar1 = indent_local;
      if (pcVar9 != (char *)0x0) {
        libwebm::Indent::indent_str_abi_cxx11_((Indent *)((long)&codec_name.field_2 + 8));
        uVar4 = std::__cxx11::string::c_str();
        fprintf((FILE *)pIVar1,"%sCodecID     : %s\n",uVar4,pcVar9);
        std::__cxx11::string::~string((string *)((long)&codec_name.field_2 + 8));
      }
      p_Var6 = (_anonymous_namespace_ *)mkvparser::Track::GetCodecNameAsUTF8(&local_70->super_Track)
      ;
      (anonymous_namespace)::UTF8ToWideString_abi_cxx11_((wstring *)local_178,p_Var6,str_00);
      uVar7 = std::__cxx11::wstring::empty();
      pIVar1 = indent_local;
      if ((uVar7 & 1) == 0) {
        libwebm::Indent::indent_str_abi_cxx11_((Indent *)&private_size);
        uVar4 = std::__cxx11::string::c_str();
        uVar8 = std::__cxx11::wstring::c_str();
        fprintf((FILE *)pIVar1,"%sCodecName   : %ls\n",uVar4,uVar8);
        std::__cxx11::string::~string((string *)&private_size);
      }
      local_1c8._32_8_ =
           mkvparser::Track::GetCodecPrivate(&local_70->super_Track,(size_t *)&private_data);
      pIVar1 = indent_local;
      if ((uchar *)local_1c8._32_8_ == (uchar *)0x0) {
LAB_0013212e:
        local_2a8 = mkvparser::Track::GetDefaultDuration(&local_70->super_Track);
        pIVar1 = indent_local;
        if (local_2a8 != 0) {
          libwebm::Indent::indent_str_abi_cxx11_((Indent *)&encoding);
          uVar4 = std::__cxx11::string::c_str();
          fprintf((FILE *)pIVar1,"%sDefaultDuration: %lu\n",uVar4,local_2a8);
          std::__cxx11::string::~string((string *)&encoding);
        }
        uVar10 = mkvparser::Track::GetContentEncodingCount(&local_70->super_Track);
        if (uVar10 != 0) {
          local_2f0._32_8_ = mkvparser::Track::GetContentEncodingByIndex(&local_70->super_Track,0);
          pIVar1 = indent_local;
          if ((ContentEncoding *)local_2f0._32_8_ == (ContentEncoding *)0x0) {
            printf("Could not get first ContentEncoding.\n");
            segment_local._7_1_ = 0;
            local_240._32_4_ = 1;
            goto LAB_00133d74;
          }
          libwebm::Indent::indent_str_abi_cxx11_((Indent *)local_2f0);
          uVar4 = std::__cxx11::string::c_str();
          uVar11 = mkvparser::ContentEncoding::encoding_order((ContentEncoding *)local_2f0._32_8_);
          fprintf((FILE *)pIVar1,"%sContentEncodingOrder : %lld\n",uVar4,uVar11);
          std::__cxx11::string::~string((string *)local_2f0);
          pIVar1 = indent_local;
          libwebm::Indent::indent_str_abi_cxx11_((Indent *)local_310);
          uVar4 = std::__cxx11::string::c_str();
          uVar11 = mkvparser::ContentEncoding::encoding_scope((ContentEncoding *)local_2f0._32_8_);
          fprintf((FILE *)pIVar1,"%sContentEncodingScope : %lld\n",uVar4,uVar11);
          std::__cxx11::string::~string((string *)local_310);
          pIVar1 = indent_local;
          libwebm::Indent::indent_str_abi_cxx11_((Indent *)&encryption);
          uVar4 = std::__cxx11::string::c_str();
          uVar11 = mkvparser::ContentEncoding::encoding_type((ContentEncoding *)local_2f0._32_8_);
          fprintf((FILE *)pIVar1,"%sContentEncodingType  : %lld\n",uVar4,uVar11);
          std::__cxx11::string::~string((string *)&encryption);
          uVar10 = mkvparser::ContentEncoding::GetEncryptionCount
                             ((ContentEncoding *)local_2f0._32_8_);
          if (uVar10 != 0) {
            local_358._32_8_ =
                 mkvparser::ContentEncoding::GetEncryptionByIndex
                           ((ContentEncoding *)local_2f0._32_8_,0);
            pIVar1 = indent_local;
            if ((ContentEncryption *)local_358._32_8_ == (ContentEncryption *)0x0) {
              printf("Could not get first ContentEncryption.\n");
              segment_local._7_1_ = 0;
              local_240._32_4_ = 1;
              goto LAB_00133d74;
            }
            libwebm::Indent::indent_str_abi_cxx11_((Indent *)local_358);
            uVar4 = std::__cxx11::string::c_str();
            fprintf((FILE *)pIVar1,"%sContentEncAlgo       : %lld\n",uVar4,
                    *(unsigned_long_long *)local_358._32_8_);
            std::__cxx11::string::~string((string *)local_358);
            pIVar1 = indent_local;
            if (0 < *(longlong *)(local_358._32_8_ + 0x10)) {
              libwebm::Indent::indent_str_abi_cxx11_((Indent *)local_378);
              uVar4 = std::__cxx11::string::c_str();
              fprintf((FILE *)pIVar1,"%sContentEncKeyID      : ",uVar4);
              std::__cxx11::string::~string((string *)local_378);
              for (local_37c = 0; (long)local_37c < *(longlong *)(local_358._32_8_ + 0x10);
                  local_37c = local_37c + 1) {
                fprintf((FILE *)indent_local,"0x%02x, ",
                        (ulong)(*(uchar **)(local_358._32_8_ + 8))[local_37c]);
              }
              fprintf((FILE *)indent_local,"\n");
            }
            pIVar1 = indent_local;
            if (0 < *(longlong *)(local_358._32_8_ + 0x20)) {
              libwebm::Indent::indent_str_abi_cxx11_((Indent *)local_3a0);
              uVar4 = std::__cxx11::string::c_str();
              fprintf((FILE *)pIVar1,"%sContentSignature     : 0x",uVar4);
              std::__cxx11::string::~string((string *)local_3a0);
              for (local_3a4 = 0; (long)local_3a4 < *(longlong *)(local_358._32_8_ + 0x20);
                  local_3a4 = local_3a4 + 1) {
                fprintf((FILE *)indent_local,"%x",
                        (ulong)(*(uchar **)(local_358._32_8_ + 0x18))[local_3a4]);
              }
              fprintf((FILE *)indent_local,"\n");
            }
            pIVar1 = indent_local;
            if (0 < *(longlong *)(local_358._32_8_ + 0x30)) {
              libwebm::Indent::indent_str_abi_cxx11_((Indent *)local_3c8);
              uVar4 = std::__cxx11::string::c_str();
              fprintf((FILE *)pIVar1,"%sContentSigKeyID      : 0x",uVar4);
              std::__cxx11::string::~string((string *)local_3c8);
              for (local_3f0._36_4_ = 0;
                  (long)(int)local_3f0._36_4_ < *(longlong *)(local_358._32_8_ + 0x30);
                  local_3f0._36_4_ = local_3f0._36_4_ + 1) {
                fprintf((FILE *)indent_local,"%x",
                        (ulong)(*(uchar **)(local_358._32_8_ + 0x28))[(int)local_3f0._36_4_]);
              }
              fprintf((FILE *)indent_local,"\n");
            }
            pIVar1 = indent_local;
            libwebm::Indent::indent_str_abi_cxx11_(&local_3f0);
            uVar4 = std::__cxx11::string::c_str();
            fprintf((FILE *)pIVar1,"%sContentSigAlgo       : %lld\n",uVar4,
                    *(unsigned_long_long *)(local_358._32_8_ + 0x38));
            std::__cxx11::string::~string((string *)&local_3f0);
            pIVar1 = indent_local;
            libwebm::Indent::indent_str_abi_cxx11_((Indent *)&aes);
            uVar4 = std::__cxx11::string::c_str();
            fprintf((FILE *)pIVar1,"%sContentSigHashAlgo   : %lld\n",uVar4,
                    *(unsigned_long_long *)(local_358._32_8_ + 0x40));
            std::__cxx11::string::~string((string *)&aes);
            pIVar1 = indent_local;
            local_418 = (ContentEncAESSettings *)(local_358._32_8_ + 0x48);
            libwebm::Indent::indent_str_abi_cxx11_((Indent *)&video_track);
            uVar4 = std::__cxx11::string::c_str();
            fprintf((FILE *)pIVar1,"%sCipherMode           : %lld\n",uVar4,local_418->cipher_mode);
            std::__cxx11::string::~string((string *)&video_track);
          }
        }
        if (lVar5 == 1) {
          width = (int64_t)local_70;
          height = mkvparser::VideoTrack::GetWidth(local_70);
          display_width = mkvparser::VideoTrack::GetHeight((VideoTrack *)width);
          display_height = mkvparser::VideoTrack::GetDisplayWidth((VideoTrack *)width);
          display_unit = mkvparser::VideoTrack::GetDisplayHeight((VideoTrack *)width);
          frame_rate = (double)mkvparser::VideoTrack::GetDisplayUnit((VideoTrack *)width);
          local_490._32_8_ = mkvparser::VideoTrack::GetFrameRate((VideoTrack *)width);
          pIVar1 = indent_local;
          libwebm::Indent::indent_str_abi_cxx11_((Indent *)local_490);
          uVar4 = std::__cxx11::string::c_str();
          fprintf((FILE *)pIVar1,"%sPixelWidth  : %ld\n",uVar4,height);
          std::__cxx11::string::~string((string *)local_490);
          pIVar1 = indent_local;
          libwebm::Indent::indent_str_abi_cxx11_((Indent *)local_4b0);
          uVar4 = std::__cxx11::string::c_str();
          fprintf((FILE *)pIVar1,"%sPixelHeight : %ld\n",uVar4,display_width);
          std::__cxx11::string::~string((string *)local_4b0);
          pIVar1 = indent_local;
          if (0.0 < (double)local_490._32_8_) {
            libwebm::Indent::indent_str_abi_cxx11_((Indent *)local_4d0);
            uVar4 = std::__cxx11::string::c_str();
            dVar12 = mkvparser::VideoTrack::GetFrameRate((VideoTrack *)width);
            fprintf((FILE *)pIVar1,"%sFrameRate   : %g\n",dVar12,uVar4);
            std::__cxx11::string::~string((string *)local_4d0);
          }
          pIVar1 = indent_local;
          if (((0 < (long)frame_rate) || (display_height != height)) ||
             (display_unit != display_width)) {
            libwebm::Indent::indent_str_abi_cxx11_((Indent *)local_4f0);
            uVar4 = std::__cxx11::string::c_str();
            fprintf((FILE *)pIVar1,"%sDisplayWidth  : %ld\n",uVar4,display_height);
            std::__cxx11::string::~string((string *)local_4f0);
            pIVar1 = indent_local;
            libwebm::Indent::indent_str_abi_cxx11_((Indent *)local_510);
            uVar4 = std::__cxx11::string::c_str();
            fprintf((FILE *)pIVar1,"%sDisplayHeight : %ld\n",uVar4,display_unit);
            std::__cxx11::string::~string((string *)local_510);
            pIVar1 = indent_local;
            libwebm::Indent::indent_str_abi_cxx11_((Indent *)&colour);
            uVar4 = std::__cxx11::string::c_str();
            fprintf((FILE *)pIVar1,"%sDisplayUnit   : %ld\n",uVar4,frame_rate);
            std::__cxx11::string::~string((string *)&colour);
          }
          local_538 = mkvparser::VideoTrack::GetColour((VideoTrack *)width);
          pIVar1 = indent_local;
          if (local_538 != (Colour *)0x0) {
            libwebm::Indent::indent_str_abi_cxx11_((Indent *)&matrix_coefficients);
            uVar4 = std::__cxx11::string::c_str();
            fprintf((FILE *)pIVar1,"%sColour:\n",uVar4);
            std::__cxx11::string::~string((string *)&matrix_coefficients);
            libwebm::Indent::Adjust((Indent *)tracks,2);
            pIVar1 = indent_local;
            bits_per_channel = local_538->matrix_coefficients;
            chroma_subsampling_horz = local_538->bits_per_channel;
            chroma_subsampling_vert = local_538->chroma_subsampling_horz;
            cb_subsampling_horz = local_538->chroma_subsampling_vert;
            cb_subsampling_vert = local_538->cb_subsampling_horz;
            chroma_siting_horz = local_538->cb_subsampling_vert;
            chroma_siting_vert = local_538->chroma_siting_horz;
            range = local_538->chroma_siting_vert;
            transfer_characteristics = local_538->range;
            primaries = local_538->transfer_characteristics;
            max_cll = local_538->primaries;
            max_fall = local_538->max_cll;
            local_5e0._32_8_ = local_538->max_fall;
            if (bits_per_channel != 0x7fffffffffffffff) {
              libwebm::Indent::indent_str_abi_cxx11_((Indent *)(local_600 + 0x20));
              uVar4 = std::__cxx11::string::c_str();
              fprintf((FILE *)pIVar1,"%sMatrixCoefficients      : %ld\n",uVar4,bits_per_channel);
              std::__cxx11::string::~string((string *)(local_600 + 0x20));
            }
            pIVar1 = indent_local;
            if (chroma_subsampling_horz != 0x7fffffffffffffff) {
              libwebm::Indent::indent_str_abi_cxx11_((Indent *)local_600);
              uVar4 = std::__cxx11::string::c_str();
              fprintf((FILE *)pIVar1,"%sBitsPerChannel          : %ld\n",uVar4,
                      chroma_subsampling_horz);
              std::__cxx11::string::~string((string *)local_600);
            }
            pIVar1 = indent_local;
            if (chroma_subsampling_vert != 0x7fffffffffffffff) {
              libwebm::Indent::indent_str_abi_cxx11_((Indent *)local_620);
              uVar4 = std::__cxx11::string::c_str();
              fprintf((FILE *)pIVar1,"%sChromaSubsamplingHorz   : %ld\n",uVar4,
                      chroma_subsampling_vert);
              std::__cxx11::string::~string((string *)local_620);
            }
            pIVar1 = indent_local;
            if (cb_subsampling_horz != 0x7fffffffffffffff) {
              libwebm::Indent::indent_str_abi_cxx11_((Indent *)local_640);
              uVar4 = std::__cxx11::string::c_str();
              fprintf((FILE *)pIVar1,"%sChromaSubsamplingVert   : %ld\n",uVar4,cb_subsampling_horz);
              std::__cxx11::string::~string((string *)local_640);
            }
            pIVar1 = indent_local;
            if (cb_subsampling_vert != 0x7fffffffffffffff) {
              libwebm::Indent::indent_str_abi_cxx11_((Indent *)local_660);
              uVar4 = std::__cxx11::string::c_str();
              fprintf((FILE *)pIVar1,"%sCbSubsamplingHorz       : %ld\n",uVar4,cb_subsampling_vert);
              std::__cxx11::string::~string((string *)local_660);
            }
            pIVar1 = indent_local;
            if (chroma_siting_horz != 0x7fffffffffffffff) {
              libwebm::Indent::indent_str_abi_cxx11_((Indent *)local_680);
              uVar4 = std::__cxx11::string::c_str();
              fprintf((FILE *)pIVar1,"%sCbSubsamplingVert       : %ld\n",uVar4,chroma_siting_horz);
              std::__cxx11::string::~string((string *)local_680);
            }
            pIVar1 = indent_local;
            if (chroma_siting_vert != 0x7fffffffffffffff) {
              libwebm::Indent::indent_str_abi_cxx11_((Indent *)local_6a0);
              uVar4 = std::__cxx11::string::c_str();
              fprintf((FILE *)pIVar1,"%sChromaSitingHorz        : %ld\n",uVar4,chroma_siting_vert);
              std::__cxx11::string::~string((string *)local_6a0);
            }
            pIVar1 = indent_local;
            if (range != 0x7fffffffffffffff) {
              libwebm::Indent::indent_str_abi_cxx11_((Indent *)local_6c0);
              uVar4 = std::__cxx11::string::c_str();
              fprintf((FILE *)pIVar1,"%sChromaSitingVert        : %ld\n",uVar4,range);
              std::__cxx11::string::~string((string *)local_6c0);
            }
            pIVar1 = indent_local;
            if (transfer_characteristics != 0x7fffffffffffffff) {
              libwebm::Indent::indent_str_abi_cxx11_((Indent *)local_6e0);
              uVar4 = std::__cxx11::string::c_str();
              fprintf((FILE *)pIVar1,"%sRange                   : %ld\n",uVar4,
                      transfer_characteristics);
              std::__cxx11::string::~string((string *)local_6e0);
            }
            pIVar1 = indent_local;
            if (primaries != 0x7fffffffffffffff) {
              libwebm::Indent::indent_str_abi_cxx11_((Indent *)local_700);
              uVar4 = std::__cxx11::string::c_str();
              fprintf((FILE *)pIVar1,"%sTransferCharacteristics : %ld\n",uVar4,primaries);
              std::__cxx11::string::~string((string *)local_700);
            }
            pIVar1 = indent_local;
            if (max_cll != 0x7fffffffffffffff) {
              libwebm::Indent::indent_str_abi_cxx11_((Indent *)local_720);
              uVar4 = std::__cxx11::string::c_str();
              fprintf((FILE *)pIVar1,"%sPrimaries               : %ld\n",uVar4,max_cll);
              std::__cxx11::string::~string((string *)local_720);
            }
            pIVar1 = indent_local;
            if (max_fall != 0x7fffffffffffffff) {
              libwebm::Indent::indent_str_abi_cxx11_((Indent *)local_740);
              uVar4 = std::__cxx11::string::c_str();
              fprintf((FILE *)pIVar1,"%sMaxCLL                  : %ld\n",uVar4,max_fall);
              std::__cxx11::string::~string((string *)local_740);
            }
            pIVar1 = indent_local;
            if (local_5e0._32_8_ != 0x7fffffffffffffff) {
              libwebm::Indent::indent_str_abi_cxx11_((Indent *)&metadata);
              uVar4 = std::__cxx11::string::c_str();
              fprintf((FILE *)pIVar1,"%sMaxFALL                 : %ld\n",uVar4,local_5e0._32_8_);
              std::__cxx11::string::~string((string *)&metadata);
            }
            pIVar1 = indent_local;
            local_768 = local_538->mastering_metadata;
            if (local_768 != (MasteringMetadata *)0x0) {
              libwebm::Indent::indent_str_abi_cxx11_((Indent *)&red);
              uVar4 = std::__cxx11::string::c_str();
              fprintf((FILE *)pIVar1,"%sMasteringMetadata:\n",uVar4);
              std::__cxx11::string::~string((string *)&red);
              libwebm::Indent::Adjust((Indent *)tracks,2);
              pIVar1 = indent_local;
              green = local_768->r;
              blue = local_768->g;
              white = local_768->b;
              _min = local_768->white_point;
              local_7ac = local_768->luminance_max;
              local_7d0._32_4_ = local_768->luminance_min;
              if (green != (PrimaryChromaticity *)0x0) {
                libwebm::Indent::indent_str_abi_cxx11_((Indent *)local_7d0);
                uVar4 = std::__cxx11::string::c_str();
                fprintf((FILE *)pIVar1,"%sPrimaryRChromaticityX   : %g\n",(double)green->x,uVar4);
                std::__cxx11::string::~string((string *)local_7d0);
                pIVar1 = indent_local;
                libwebm::Indent::indent_str_abi_cxx11_((Indent *)local_7f0);
                uVar4 = std::__cxx11::string::c_str();
                fprintf((FILE *)pIVar1,"%sPrimaryRChromaticityY   : %g\n",(double)green->y,uVar4);
                std::__cxx11::string::~string((string *)local_7f0);
              }
              pIVar1 = indent_local;
              if (blue != (PrimaryChromaticity *)0x0) {
                libwebm::Indent::indent_str_abi_cxx11_((Indent *)local_810);
                uVar4 = std::__cxx11::string::c_str();
                fprintf((FILE *)pIVar1,"%sPrimaryGChromaticityX   : %g\n",(double)blue->x,uVar4);
                std::__cxx11::string::~string((string *)local_810);
                pIVar1 = indent_local;
                libwebm::Indent::indent_str_abi_cxx11_((Indent *)local_830);
                uVar4 = std::__cxx11::string::c_str();
                fprintf((FILE *)pIVar1,"%sPrimaryGChromaticityY   : %g\n",(double)blue->y,uVar4);
                std::__cxx11::string::~string((string *)local_830);
              }
              pIVar1 = indent_local;
              if (white != (PrimaryChromaticity *)0x0) {
                libwebm::Indent::indent_str_abi_cxx11_((Indent *)local_850);
                uVar4 = std::__cxx11::string::c_str();
                fprintf((FILE *)pIVar1,"%sPrimaryBChromaticityX   : %g\n",(double)white->x,uVar4);
                std::__cxx11::string::~string((string *)local_850);
                pIVar1 = indent_local;
                libwebm::Indent::indent_str_abi_cxx11_((Indent *)local_870);
                uVar4 = std::__cxx11::string::c_str();
                fprintf((FILE *)pIVar1,"%sPrimaryBChromaticityY   : %g\n",(double)white->y,uVar4);
                std::__cxx11::string::~string((string *)local_870);
              }
              pIVar1 = indent_local;
              if (_min != (PrimaryChromaticity *)0x0) {
                libwebm::Indent::indent_str_abi_cxx11_((Indent *)local_890);
                uVar4 = std::__cxx11::string::c_str();
                fprintf((FILE *)pIVar1,"%sWhitePointChromaticityX : %g\n",(double)_min->x,uVar4);
                std::__cxx11::string::~string((string *)local_890);
                pIVar1 = indent_local;
                libwebm::Indent::indent_str_abi_cxx11_((Indent *)local_8b0);
                uVar4 = std::__cxx11::string::c_str();
                fprintf((FILE *)pIVar1,"%sWhitePointChromaticityY : %g\n",(double)_min->y,uVar4);
                std::__cxx11::string::~string((string *)local_8b0);
              }
              pIVar1 = indent_local;
              if ((local_7ac != 3.4028235e+38) || (NAN(local_7ac))) {
                libwebm::Indent::indent_str_abi_cxx11_((Indent *)local_8d0);
                uVar4 = std::__cxx11::string::c_str();
                fprintf((FILE *)pIVar1,"%sLuminanceMax            : %g\n",(double)local_7ac,uVar4);
                std::__cxx11::string::~string((string *)local_8d0);
              }
              pIVar1 = indent_local;
              if (((float)local_7d0._32_4_ != 3.4028235e+38) || (NAN((float)local_7d0._32_4_))) {
                libwebm::Indent::indent_str_abi_cxx11_((Indent *)&projection);
                uVar4 = std::__cxx11::string::c_str();
                fprintf((FILE *)pIVar1,"%sLuminanceMin            : %g\n",
                        (double)(float)local_7d0._32_4_,uVar4);
                std::__cxx11::string::~string((string *)&projection);
              }
              libwebm::Indent::Adjust((Indent *)tracks,-2);
            }
            libwebm::Indent::Adjust((Indent *)tracks,-2);
          }
          local_8f8 = mkvparser::VideoTrack::GetProjection((VideoTrack *)width);
          pIVar1 = indent_local;
          if (local_8f8 != (Projection *)0x0) {
            libwebm::Indent::indent_str_abi_cxx11_((Indent *)&kTypeNotPresent);
            uVar4 = std::__cxx11::string::c_str();
            fprintf((FILE *)pIVar1,"%sProjection:\n",uVar4);
            std::__cxx11::string::~string((string *)&kTypeNotPresent);
            libwebm::Indent::Adjust((Indent *)tracks,2);
            pIVar1 = indent_local;
            kValueNotPresent = (float)local_8f8->type;
            local_920 = 0xffffffff;
            local_924 = 3.4028235e+38;
            if (kValueNotPresent != -NAN) {
              libwebm::Indent::indent_str_abi_cxx11_((Indent *)local_948);
              uVar4 = std::__cxx11::string::c_str();
              fprintf((FILE *)pIVar1,"%sProjectionType            : %d\n",uVar4,
                      (ulong)(uint)kValueNotPresent);
              std::__cxx11::string::~string((string *)local_948);
            }
            pIVar1 = indent_local;
            if (local_8f8->private_data != (uchar *)0x0) {
              libwebm::Indent::indent_str_abi_cxx11_((Indent *)local_968);
              uVar4 = std::__cxx11::string::c_str();
              fprintf((FILE *)pIVar1,"%sProjectionPrivate(size)   : %d\n",uVar4,
                      local_8f8->private_data_length & 0xffffffff);
              std::__cxx11::string::~string((string *)local_968);
            }
            pIVar1 = indent_local;
            if ((local_8f8->pose_yaw != local_924) || (NAN(local_8f8->pose_yaw) || NAN(local_924)))
            {
              libwebm::Indent::indent_str_abi_cxx11_((Indent *)local_988);
              uVar4 = std::__cxx11::string::c_str();
              fprintf((FILE *)pIVar1,"%sProjectionPoseYaw         : %g\n",
                      (double)local_8f8->pose_yaw,uVar4);
              std::__cxx11::string::~string((string *)local_988);
            }
            pIVar1 = indent_local;
            if ((local_8f8->pose_pitch != local_924) ||
               (NAN(local_8f8->pose_pitch) || NAN(local_924))) {
              libwebm::Indent::indent_str_abi_cxx11_((Indent *)local_9a8);
              uVar4 = std::__cxx11::string::c_str();
              fprintf((FILE *)pIVar1,"%sProjectionPosePitch       : %g\n",
                      (double)local_8f8->pose_pitch,uVar4);
              std::__cxx11::string::~string((string *)local_9a8);
            }
            pIVar1 = indent_local;
            if ((local_8f8->pose_roll != local_924) || (NAN(local_8f8->pose_roll) || NAN(local_924))
               ) {
              libwebm::Indent::indent_str_abi_cxx11_((Indent *)&audio_track);
              uVar4 = std::__cxx11::string::c_str();
              fprintf((FILE *)pIVar1,"%sProjectionPoseRoll         : %g\n",
                      (double)local_8f8->pose_roll,uVar4);
              std::__cxx11::string::~string((string *)&audio_track);
            }
            libwebm::Indent::Adjust((Indent *)tracks,-2);
          }
        }
        else if (lVar5 == 2) {
          channels = (int64_t)local_70;
          bit_depth = mkvparser::AudioTrack::GetChannels((AudioTrack *)local_70);
          codec_delay = mkvparser::AudioTrack::GetBitDepth((AudioTrack *)channels);
          seek_preroll = mkvparser::Track::GetCodecDelay((Track *)channels);
          local_a10._32_8_ = mkvparser::Track::GetSeekPreRoll((Track *)channels);
          pIVar1 = indent_local;
          libwebm::Indent::indent_str_abi_cxx11_((Indent *)(local_a30 + 0x20));
          uVar4 = std::__cxx11::string::c_str();
          fprintf((FILE *)pIVar1,"%sChannels         : %ld\n",uVar4,bit_depth);
          std::__cxx11::string::~string((string *)(local_a30 + 0x20));
          pIVar1 = indent_local;
          if (0 < (long)codec_delay) {
            libwebm::Indent::indent_str_abi_cxx11_((Indent *)local_a30);
            uVar4 = std::__cxx11::string::c_str();
            fprintf((FILE *)pIVar1,"%sBitDepth         : %ld\n",uVar4,codec_delay);
            std::__cxx11::string::~string((string *)local_a30);
          }
          pIVar1 = indent_local;
          libwebm::Indent::indent_str_abi_cxx11_((Indent *)local_a50);
          uVar4 = std::__cxx11::string::c_str();
          dVar12 = mkvparser::AudioTrack::GetSamplingRate((AudioTrack *)channels);
          fprintf((FILE *)pIVar1,"%sSamplingFrequency: %g\n",dVar12,uVar4);
          std::__cxx11::string::~string((string *)local_a50);
          pIVar1 = indent_local;
          if (seek_preroll != 0) {
            libwebm::Indent::indent_str_abi_cxx11_((Indent *)local_a70);
            uVar4 = std::__cxx11::string::c_str();
            fprintf((FILE *)pIVar1,"%sCodecDelay       : %lu\n",uVar4,seek_preroll);
            std::__cxx11::string::~string((string *)local_a70);
          }
          pIVar1 = indent_local;
          if (local_a10._32_8_ != 0) {
            libwebm::Indent::indent_str_abi_cxx11_((Indent *)local_a90);
            uVar4 = std::__cxx11::string::c_str();
            fprintf((FILE *)pIVar1,"%sSeekPreRoll      : %lu\n",uVar4,local_a10._32_8_);
            std::__cxx11::string::~string((string *)local_a90);
          }
        }
        libwebm::Indent::Adjust((Indent *)tracks,-4);
        local_240._32_4_ = 0;
      }
      else {
        libwebm::Indent::indent_str_abi_cxx11_((Indent *)local_1c8);
        uVar4 = std::__cxx11::string::c_str();
        fprintf((FILE *)pIVar1,"%sPrivateData(size): %d\n",uVar4,(int32_t)private_data);
        std::__cxx11::string::~string((string *)local_1c8);
        if (lVar5 != 1) goto LAB_0013212e;
        pcVar9 = mkvparser::Track::GetCodecId(&local_70->super_Track);
        (anonymous_namespace)::ToString_abi_cxx11_(local_1e8,pcVar9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&features.chroma_subsampling,"V_VP9",
                   (allocator *)((long)&features.bit_depth + 3));
        std::allocator<char>::~allocator((allocator<char> *)((long)&features.bit_depth + 3));
        _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_1e8,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&features.chroma_subsampling);
        if (_Var2) {
          libwebm::Vp9CodecFeatures::Vp9CodecFeatures((Vp9CodecFeatures *)(local_240 + 0x24));
          bVar3 = libwebm::ParseVpxCodecPrivate
                            ((uint8_t *)local_1c8._32_8_,(int32_t)private_data,
                             (Vp9CodecFeatures *)(local_240 + 0x24));
          pIVar1 = indent_local;
          if (bVar3) {
            if (local_240._36_4_ != 0xffffffff) {
              libwebm::Indent::indent_str_abi_cxx11_((Indent *)local_240);
              uVar4 = std::__cxx11::string::c_str();
              fprintf((FILE *)pIVar1,"%sVP9 profile            : %d\n",uVar4,
                      (ulong)(uint)local_240._36_4_);
              std::__cxx11::string::~string((string *)local_240);
            }
            pIVar1 = indent_local;
            if (local_218 != 0xffffffff) {
              libwebm::Indent::indent_str_abi_cxx11_((Indent *)local_260);
              uVar4 = std::__cxx11::string::c_str();
              fprintf((FILE *)pIVar1,"%sVP9 level              : %d\n",uVar4,(ulong)local_218);
              std::__cxx11::string::~string((string *)local_260);
            }
            pIVar1 = indent_local;
            if (features.profile != -1) {
              libwebm::Indent::indent_str_abi_cxx11_((Indent *)local_280);
              uVar4 = std::__cxx11::string::c_str();
              fprintf((FILE *)pIVar1,"%sVP9 bit_depth          : %d\n",uVar4,
                      (ulong)(uint)features.profile);
              std::__cxx11::string::~string((string *)local_280);
            }
            pIVar1 = indent_local;
            if (features.level != -1) {
              libwebm::Indent::indent_str_abi_cxx11_((Indent *)&default_duration);
              uVar4 = std::__cxx11::string::c_str();
              fprintf((FILE *)pIVar1,"%sVP9 chroma subsampling : %d\n",uVar4,
                      (ulong)(uint)features.level);
              std::__cxx11::string::~string((string *)&default_duration);
            }
            local_240._32_4_ = 0;
          }
          else {
            fprintf(_stderr,"Error parsing VpxCodecPrivate.\n");
            segment_local._7_1_ = 0;
            local_240._32_4_ = 1;
          }
          libwebm::Vp9CodecFeatures::~Vp9CodecFeatures((Vp9CodecFeatures *)(local_240 + 0x24));
          if (local_240._32_4_ == 0) goto LAB_001320db;
        }
        else {
LAB_001320db:
          local_240._32_4_ = 0;
        }
        std::__cxx11::string::~string((string *)&features.chroma_subsampling);
        std::__cxx11::string::~string((string *)local_1e8);
        if (local_240._32_4_ == 0) goto LAB_0013212e;
      }
LAB_00133d74:
      std::__cxx11::wstring::~wstring((wstring *)local_178);
      std::__cxx11::wstring::~wstring((wstring *)local_c0);
    } while (local_240._32_4_ == 0);
  }
LAB_00133dbd:
  return (bool)(segment_local._7_1_ & 1);
}

Assistant:

bool OutputTracks(const mkvparser::Segment& segment, const Options& options,
                  FILE* o, Indent* indent) {
  const mkvparser::Tracks* const tracks = segment.GetTracks();
  if (!tracks) {
    fprintf(stderr, "Tracks was NULL.\n");
    return false;
  }

  fprintf(o, "%sTracks:", indent->indent_str().c_str());
  if (options.output_offset)
    fprintf(o, "  @: %lld", tracks->m_element_start);
  if (options.output_size)
    fprintf(o, "  size: %lld", tracks->m_element_size);
  fprintf(o, "\n");

  unsigned int i = 0;
  const unsigned long j = tracks->GetTracksCount();
  while (i != j) {
    const mkvparser::Track* const track = tracks->GetTrackByIndex(i++);
    if (track == NULL)
      continue;

    indent->Adjust(libwebm::kIncreaseIndent);
    fprintf(o, "%sTrack:", indent->indent_str().c_str());
    if (options.output_offset)
      fprintf(o, "  @: %lld", track->m_element_start);
    if (options.output_size)
      fprintf(o, "  size: %lld", track->m_element_size);
    fprintf(o, "\n");

    const int64_t track_type = track->GetType();
    const int64_t track_number = track->GetNumber();
    const wstring track_name = UTF8ToWideString(track->GetNameAsUTF8());

    indent->Adjust(libwebm::kIncreaseIndent);
    fprintf(o, "%sTrackType   : %" PRId64 "\n", indent->indent_str().c_str(),
            track_type);
    fprintf(o, "%sTrackNumber : %" PRId64 "\n", indent->indent_str().c_str(),
            track_number);
    if (!track_name.empty())
      fprintf(o, "%sName        : %ls\n", indent->indent_str().c_str(),
              track_name.c_str());

    const char* const codec_id = track->GetCodecId();
    if (codec_id)
      fprintf(o, "%sCodecID     : %s\n", indent->indent_str().c_str(),
              codec_id);

    const wstring codec_name = UTF8ToWideString(track->GetCodecNameAsUTF8());
    if (!codec_name.empty())
      fprintf(o, "%sCodecName   : %ls\n", indent->indent_str().c_str(),
              codec_name.c_str());

    size_t private_size;
    const unsigned char* const private_data =
        track->GetCodecPrivate(private_size);
    if (private_data) {
      fprintf(o, "%sPrivateData(size): %d\n", indent->indent_str().c_str(),
              static_cast<int>(private_size));

      if (track_type == mkvparser::Track::kVideo) {
        const std::string codec_id = ToString(track->GetCodecId());
        const std::string v_vp9 = "V_VP9";
        if (codec_id == v_vp9) {
          libwebm::Vp9CodecFeatures features;
          if (!libwebm::ParseVpxCodecPrivate(private_data,
                                             static_cast<int32_t>(private_size),
                                             &features)) {
            fprintf(stderr, "Error parsing VpxCodecPrivate.\n");
            return false;
          }
          if (features.profile != -1)
            fprintf(o, "%sVP9 profile            : %d\n",
                    indent->indent_str().c_str(), features.profile);
          if (features.level != -1)
            fprintf(o, "%sVP9 level              : %d\n",
                    indent->indent_str().c_str(), features.level);
          if (features.bit_depth != -1)
            fprintf(o, "%sVP9 bit_depth          : %d\n",
                    indent->indent_str().c_str(), features.bit_depth);
          if (features.chroma_subsampling != -1)
            fprintf(o, "%sVP9 chroma subsampling : %d\n",
                    indent->indent_str().c_str(), features.chroma_subsampling);
        }
      }
    }

    const uint64_t default_duration = track->GetDefaultDuration();
    if (default_duration > 0)
      fprintf(o, "%sDefaultDuration: %" PRIu64 "\n",
              indent->indent_str().c_str(), default_duration);

    if (track->GetContentEncodingCount() > 0) {
      // Only check the first content encoding.
      const ContentEncoding* const encoding =
          track->GetContentEncodingByIndex(0);
      if (!encoding) {
        printf("Could not get first ContentEncoding.\n");
        return false;
      }

      fprintf(o, "%sContentEncodingOrder : %lld\n",
              indent->indent_str().c_str(), encoding->encoding_order());
      fprintf(o, "%sContentEncodingScope : %lld\n",
              indent->indent_str().c_str(), encoding->encoding_scope());
      fprintf(o, "%sContentEncodingType  : %lld\n",
              indent->indent_str().c_str(), encoding->encoding_type());

      if (encoding->GetEncryptionCount() > 0) {
        // Only check the first encryption.
        const ContentEncoding::ContentEncryption* const encryption =
            encoding->GetEncryptionByIndex(0);
        if (!encryption) {
          printf("Could not get first ContentEncryption.\n");
          return false;
        }

        fprintf(o, "%sContentEncAlgo       : %lld\n",
                indent->indent_str().c_str(), encryption->algo);

        if (encryption->key_id_len > 0) {
          fprintf(o, "%sContentEncKeyID      : ", indent->indent_str().c_str());
          for (int k = 0; k < encryption->key_id_len; ++k) {
            fprintf(o, "0x%02x, ", encryption->key_id[k]);
          }
          fprintf(o, "\n");
        }

        if (encryption->signature_len > 0) {
          fprintf(o, "%sContentSignature     : 0x",
                  indent->indent_str().c_str());
          for (int k = 0; k < encryption->signature_len; ++k) {
            fprintf(o, "%x", encryption->signature[k]);
          }
          fprintf(o, "\n");
        }

        if (encryption->sig_key_id_len > 0) {
          fprintf(o, "%sContentSigKeyID      : 0x",
                  indent->indent_str().c_str());
          for (int k = 0; k < encryption->sig_key_id_len; ++k) {
            fprintf(o, "%x", encryption->sig_key_id[k]);
          }
          fprintf(o, "\n");
        }

        fprintf(o, "%sContentSigAlgo       : %lld\n",
                indent->indent_str().c_str(), encryption->sig_algo);
        fprintf(o, "%sContentSigHashAlgo   : %lld\n",
                indent->indent_str().c_str(), encryption->sig_hash_algo);

        const ContentEncoding::ContentEncAESSettings& aes =
            encryption->aes_settings;
        fprintf(o, "%sCipherMode           : %lld\n",
                indent->indent_str().c_str(), aes.cipher_mode);
      }
    }

    if (track_type == mkvparser::Track::kVideo) {
      const mkvparser::VideoTrack* const video_track =
          static_cast<const mkvparser::VideoTrack*>(track);
      const int64_t width = video_track->GetWidth();
      const int64_t height = video_track->GetHeight();
      const int64_t display_width = video_track->GetDisplayWidth();
      const int64_t display_height = video_track->GetDisplayHeight();
      const int64_t display_unit = video_track->GetDisplayUnit();
      const double frame_rate = video_track->GetFrameRate();
      fprintf(o, "%sPixelWidth  : %" PRId64 "\n", indent->indent_str().c_str(),
              width);
      fprintf(o, "%sPixelHeight : %" PRId64 "\n", indent->indent_str().c_str(),
              height);
      if (frame_rate > 0.0)
        fprintf(o, "%sFrameRate   : %g\n", indent->indent_str().c_str(),
                video_track->GetFrameRate());
      if (display_unit > 0 || display_width != width ||
          display_height != height) {
        fprintf(o, "%sDisplayWidth  : %" PRId64 "\n",
                indent->indent_str().c_str(), display_width);
        fprintf(o, "%sDisplayHeight : %" PRId64 "\n",
                indent->indent_str().c_str(), display_height);
        fprintf(o, "%sDisplayUnit   : %" PRId64 "\n",
                indent->indent_str().c_str(), display_unit);
      }

      const mkvparser::Colour* const colour = video_track->GetColour();
      if (colour) {
        // TODO(fgalligan): Add support for Colour's address and size.
        fprintf(o, "%sColour:\n", indent->indent_str().c_str());
        indent->Adjust(libwebm::kIncreaseIndent);

        const int64_t matrix_coefficients = colour->matrix_coefficients;
        const int64_t bits_per_channel = colour->bits_per_channel;
        const int64_t chroma_subsampling_horz = colour->chroma_subsampling_horz;
        const int64_t chroma_subsampling_vert = colour->chroma_subsampling_vert;
        const int64_t cb_subsampling_horz = colour->cb_subsampling_horz;
        const int64_t cb_subsampling_vert = colour->cb_subsampling_vert;
        const int64_t chroma_siting_horz = colour->chroma_siting_horz;
        const int64_t chroma_siting_vert = colour->chroma_siting_vert;
        const int64_t range = colour->range;
        const int64_t transfer_characteristics =
            colour->transfer_characteristics;
        const int64_t primaries = colour->primaries;
        const int64_t max_cll = colour->max_cll;
        const int64_t max_fall = colour->max_fall;
        if (matrix_coefficients != mkvparser::Colour::kValueNotPresent)
          fprintf(o, "%sMatrixCoefficients      : %" PRId64 "\n",
                  indent->indent_str().c_str(), matrix_coefficients);
        if (bits_per_channel != mkvparser::Colour::kValueNotPresent)
          fprintf(o, "%sBitsPerChannel          : %" PRId64 "\n",
                  indent->indent_str().c_str(), bits_per_channel);
        if (chroma_subsampling_horz != mkvparser::Colour::kValueNotPresent)
          fprintf(o, "%sChromaSubsamplingHorz   : %" PRId64 "\n",
                  indent->indent_str().c_str(), chroma_subsampling_horz);
        if (chroma_subsampling_vert != mkvparser::Colour::kValueNotPresent)
          fprintf(o, "%sChromaSubsamplingVert   : %" PRId64 "\n",
                  indent->indent_str().c_str(), chroma_subsampling_vert);
        if (cb_subsampling_horz != mkvparser::Colour::kValueNotPresent)
          fprintf(o, "%sCbSubsamplingHorz       : %" PRId64 "\n",
                  indent->indent_str().c_str(), cb_subsampling_horz);
        if (cb_subsampling_vert != mkvparser::Colour::kValueNotPresent)
          fprintf(o, "%sCbSubsamplingVert       : %" PRId64 "\n",
                  indent->indent_str().c_str(), cb_subsampling_vert);
        if (chroma_siting_horz != mkvparser::Colour::kValueNotPresent)
          fprintf(o, "%sChromaSitingHorz        : %" PRId64 "\n",
                  indent->indent_str().c_str(), chroma_siting_horz);
        if (chroma_siting_vert != mkvparser::Colour::kValueNotPresent)
          fprintf(o, "%sChromaSitingVert        : %" PRId64 "\n",
                  indent->indent_str().c_str(), chroma_siting_vert);
        if (range != mkvparser::Colour::kValueNotPresent)
          fprintf(o, "%sRange                   : %" PRId64 "\n",
                  indent->indent_str().c_str(), range);
        if (transfer_characteristics != mkvparser::Colour::kValueNotPresent)
          fprintf(o, "%sTransferCharacteristics : %" PRId64 "\n",
                  indent->indent_str().c_str(), transfer_characteristics);
        if (primaries != mkvparser::Colour::kValueNotPresent)
          fprintf(o, "%sPrimaries               : %" PRId64 "\n",
                  indent->indent_str().c_str(), primaries);
        if (max_cll != mkvparser::Colour::kValueNotPresent)
          fprintf(o, "%sMaxCLL                  : %" PRId64 "\n",
                  indent->indent_str().c_str(), max_cll);
        if (max_fall != mkvparser::Colour::kValueNotPresent)
          fprintf(o, "%sMaxFALL                 : %" PRId64 "\n",
                  indent->indent_str().c_str(), max_fall);

        const mkvparser::MasteringMetadata* const metadata =
            colour->mastering_metadata;
        if (metadata) {
          // TODO(fgalligan): Add support for MasteringMetadata's address and
          // size.
          fprintf(o, "%sMasteringMetadata:\n", indent->indent_str().c_str());
          indent->Adjust(libwebm::kIncreaseIndent);

          const mkvparser::PrimaryChromaticity* const red = metadata->r;
          const mkvparser::PrimaryChromaticity* const green = metadata->g;
          const mkvparser::PrimaryChromaticity* const blue = metadata->b;
          const mkvparser::PrimaryChromaticity* const white =
              metadata->white_point;
          const float max = metadata->luminance_max;
          const float min = metadata->luminance_min;
          if (red) {
            fprintf(o, "%sPrimaryRChromaticityX   : %g\n",
                    indent->indent_str().c_str(), red->x);
            fprintf(o, "%sPrimaryRChromaticityY   : %g\n",
                    indent->indent_str().c_str(), red->y);
          }
          if (green) {
            fprintf(o, "%sPrimaryGChromaticityX   : %g\n",
                    indent->indent_str().c_str(), green->x);
            fprintf(o, "%sPrimaryGChromaticityY   : %g\n",
                    indent->indent_str().c_str(), green->y);
          }
          if (blue) {
            fprintf(o, "%sPrimaryBChromaticityX   : %g\n",
                    indent->indent_str().c_str(), blue->x);
            fprintf(o, "%sPrimaryBChromaticityY   : %g\n",
                    indent->indent_str().c_str(), blue->y);
          }
          if (white) {
            fprintf(o, "%sWhitePointChromaticityX : %g\n",
                    indent->indent_str().c_str(), white->x);
            fprintf(o, "%sWhitePointChromaticityY : %g\n",
                    indent->indent_str().c_str(), white->y);
          }
          if (max != mkvparser::MasteringMetadata::kValueNotPresent)
            fprintf(o, "%sLuminanceMax            : %g\n",
                    indent->indent_str().c_str(), max);
          if (min != mkvparser::MasteringMetadata::kValueNotPresent)
            fprintf(o, "%sLuminanceMin            : %g\n",
                    indent->indent_str().c_str(), min);
          indent->Adjust(libwebm::kDecreaseIndent);
        }
        indent->Adjust(libwebm::kDecreaseIndent);
      }

      const mkvparser::Projection* const projection =
          video_track->GetProjection();
      if (projection) {
        fprintf(o, "%sProjection:\n", indent->indent_str().c_str());
        indent->Adjust(libwebm::kIncreaseIndent);

        const int projection_type = static_cast<int>(projection->type);
        const int kTypeNotPresent =
            static_cast<int>(mkvparser::Projection::kTypeNotPresent);
        const float kValueNotPresent = mkvparser::Projection::kValueNotPresent;
        if (projection_type != kTypeNotPresent)
          fprintf(o, "%sProjectionType            : %d\n",
                  indent->indent_str().c_str(), projection_type);
        if (projection->private_data)
          fprintf(o, "%sProjectionPrivate(size)   : %d\n",
                  indent->indent_str().c_str(),
                  static_cast<int>(projection->private_data_length));
        if (projection->pose_yaw != kValueNotPresent)
          fprintf(o, "%sProjectionPoseYaw         : %g\n",
                  indent->indent_str().c_str(), projection->pose_yaw);
        if (projection->pose_pitch != kValueNotPresent)
          fprintf(o, "%sProjectionPosePitch       : %g\n",
                  indent->indent_str().c_str(), projection->pose_pitch);
        if (projection->pose_roll != kValueNotPresent)
          fprintf(o, "%sProjectionPoseRoll         : %g\n",
                  indent->indent_str().c_str(), projection->pose_roll);
        indent->Adjust(libwebm::kDecreaseIndent);
      }
    } else if (track_type == mkvparser::Track::kAudio) {
      const mkvparser::AudioTrack* const audio_track =
          static_cast<const mkvparser::AudioTrack*>(track);
      const int64_t channels = audio_track->GetChannels();
      const int64_t bit_depth = audio_track->GetBitDepth();
      const uint64_t codec_delay = audio_track->GetCodecDelay();
      const uint64_t seek_preroll = audio_track->GetSeekPreRoll();
      fprintf(o, "%sChannels         : %" PRId64 "\n",
              indent->indent_str().c_str(), channels);
      if (bit_depth > 0)
        fprintf(o, "%sBitDepth         : %" PRId64 "\n",
                indent->indent_str().c_str(), bit_depth);
      fprintf(o, "%sSamplingFrequency: %g\n", indent->indent_str().c_str(),
              audio_track->GetSamplingRate());
      if (codec_delay)
        fprintf(o, "%sCodecDelay       : %" PRIu64 "\n",
                indent->indent_str().c_str(), codec_delay);
      if (seek_preroll)
        fprintf(o, "%sSeekPreRoll      : %" PRIu64 "\n",
                indent->indent_str().c_str(), seek_preroll);
    }
    indent->Adjust(libwebm::kDecreaseIndent * 2);
  }

  return true;
}